

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O1

bool __thiscall
axl::sl::
Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,bool>,axl::sl::HashTableEntry<unsigned_long,bool>::GetBucketLink>,axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,bool>,axl::sl::HashTableEntry<unsigned_long,bool>::GetBucketLink>>>
::
setCountImpl<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,bool>,axl::sl::HashTableEntry<unsigned_long,bool>::GetBucketLink>>::Construct>
          (Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,bool>,axl::sl::HashTableEntry<unsigned_long,bool>::GetBucketLink>,axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,bool>,axl::sl::HashTableEntry<unsigned_long,bool>::GetBucketLink>>>
           *this,size_t count)

{
  int *piVar1;
  RefCount *__s;
  undefined8 uVar2;
  FreeFunc *pFVar3;
  size_t sVar4;
  EVP_PKEY_CTX *dst;
  RefCount *pRVar5;
  undefined1 *puVar6;
  void *pvVar7;
  ulong uVar8;
  undefined8 *puVar9;
  Hdr *pHVar10;
  void *__s_00;
  Hdr *pHVar11;
  void *pvVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  Ptr<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>::Hdr>
  hdr;
  Ptr<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>::Hdr>
  local_38;
  
  uVar14 = count * 0x18;
  lVar13 = *(long *)(this + 8);
  if ((lVar13 == 0) || (*(int *)(lVar13 + 0x10) != 1)) {
LAB_0011afbb:
    if (count == 0) {
      ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
      ::release((ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
                 *)this);
      return true;
    }
    if (*(long *)(this + 0x10) != 0) {
      sVar4 = getAllocSize<4096ul>(uVar14);
      dst = (EVP_PKEY_CTX *)operator_new(sVar4 + 0x30,(nothrow_t *)&std::nothrow);
      *(undefined4 *)(dst + 0x10) = 0;
      *(undefined4 *)(dst + 0x14) = 1;
      *(size_t *)(dst + 0x18) = sVar4;
      *(undefined8 *)(dst + 0x20) = 0;
      *(undefined ***)dst = &PTR__Hdr_0019cb30;
      *(code **)(dst + 8) = mem::deallocate;
      local_38.m_p = (Hdr *)0x0;
      local_38.m_refCount = (RefCount *)0x0;
      rc::
      Ptr<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>::Hdr>
      ::copy(&local_38,dst,dst);
      bVar15 = local_38.m_p != (Hdr *)0x0;
      if (bVar15) {
        (local_38.m_p)->m_count = count;
        pHVar11 = local_38.m_p + 1;
        uVar14 = *(ulong *)(this + 0x10);
        if (uVar14 < count) {
          if (0 < (long)uVar14) {
            puVar9 = *(undefined8 **)this;
            pHVar10 = pHVar11;
            do {
              uVar2 = puVar9[2];
              (pHVar10->super_BufHdr).super_RefCount.m_refCount = (int)uVar2;
              (pHVar10->super_BufHdr).super_RefCount.m_weakRefCount = (int)((ulong)uVar2 >> 0x20);
              pFVar3 = (FreeFunc *)puVar9[1];
              (pHVar10->super_BufHdr).super_RefCount._vptr_RefCount = (_func_int **)*puVar9;
              (pHVar10->super_BufHdr).super_RefCount.m_freeFunc = pFVar3;
              pHVar10 = (Hdr *)&(pHVar10->super_BufHdr).m_bufferSize;
              puVar9 = puVar9 + 3;
            } while (pHVar10 < &(pHVar11->super_BufHdr).super_RefCount + uVar14);
          }
          lVar13 = *(long *)(this + 0x10);
          if (0 < (long)(count - lVar13)) {
            __s = &(pHVar11->super_BufHdr).super_RefCount + lVar13;
            pRVar5 = (RefCount *)(&(pHVar11->super_BufHdr).m_bufferSize + lVar13 * 3);
            if (pRVar5 < __s + (count - lVar13)) {
              pRVar5 = __s + (count - lVar13);
            }
            puVar6 = (undefined1 *)((long)pRVar5 + (-0x18 - (long)__s));
            uVar14 = (ulong)(puVar6 != (undefined1 *)0x0);
            memset(__s,0,(((long)puVar6 - uVar14) / 0x18 + uVar14) * 0x18 + 0x18);
          }
        }
        else if (0 < (long)count) {
          puVar9 = *(undefined8 **)this;
          pHVar10 = pHVar11;
          do {
            uVar2 = puVar9[2];
            (pHVar10->super_BufHdr).super_RefCount.m_refCount = (int)uVar2;
            (pHVar10->super_BufHdr).super_RefCount.m_weakRefCount = (int)((ulong)uVar2 >> 0x20);
            pFVar3 = (FreeFunc *)puVar9[1];
            (pHVar10->super_BufHdr).super_RefCount._vptr_RefCount = (_func_int **)*puVar9;
            (pHVar10->super_BufHdr).super_RefCount.m_freeFunc = pFVar3;
            pHVar10 = (Hdr *)&(pHVar10->super_BufHdr).m_bufferSize;
            puVar9 = puVar9 + 3;
          } while (pHVar10 < &(pHVar11->super_BufHdr).super_RefCount + count);
        }
        puVar9 = *(undefined8 **)(this + 8);
        LOCK();
        piVar1 = (int *)(puVar9 + 2);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          (**(code **)*puVar9)(puVar9);
          LOCK();
          piVar1 = (int *)((long)puVar9 + 0x14);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if ((*piVar1 == 0) && ((code *)puVar9[1] != (code *)0x0)) {
            (*(code *)puVar9[1])(puVar9);
          }
        }
        pHVar10 = local_38.m_p;
        *(Hdr **)this = pHVar11;
        local_38.m_p = (Hdr *)0x0;
        local_38.m_refCount = (RefCount *)0x0;
        *(Hdr **)(this + 8) = pHVar10;
        *(size_t *)(this + 0x10) = count;
      }
      rc::
      Ptr<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>::Hdr>
      ::clear(&local_38);
      return bVar15;
    }
    bVar15 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
             ::reserve((Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
                        *)this,count);
    if (!bVar15) {
      return bVar15;
    }
    if ((long)count < 1) goto LAB_0011b22d;
    __s_00 = *(void **)this;
    pvVar12 = (void *)(uVar14 + (long)__s_00);
    if ((void *)(uVar14 + (long)__s_00) <= (void *)((long)__s_00 + 0x18U)) {
      pvVar12 = (void *)((long)__s_00 + 0x18U);
    }
    lVar13 = (long)pvVar12 + (-0x18 - (long)__s_00);
    uVar8 = (ulong)(lVar13 != 0);
    uVar14 = lVar13 - uVar8;
  }
  else {
    uVar8 = *(ulong *)(this + 0x10);
    bVar15 = true;
    if (count == uVar8) {
      return true;
    }
    if (*(ulong *)(lVar13 + 0x18) < uVar14) goto LAB_0011afbb;
    lVar13 = count - uVar8;
    if ((count < uVar8 || lVar13 == 0) || (lVar13 < 1)) goto LAB_0011b22d;
    __s_00 = (void *)(*(long *)this + uVar8 * 0x18);
    pvVar12 = (void *)((long)__s_00 + lVar13 * 0x18);
    pvVar7 = (void *)(*(long *)this + uVar8 * 0x18 + 0x18);
    if (pvVar7 < pvVar12) {
      pvVar7 = pvVar12;
    }
    lVar13 = (long)pvVar7 + (-0x18 - (long)__s_00);
    uVar8 = (ulong)(lVar13 != 0);
    uVar14 = lVar13 - uVar8;
  }
  memset(__s_00,0,(uVar14 / 0x18 + uVar8) * 0x18 + 0x18);
LAB_0011b22d:
  *(size_t *)(*(long *)(this + 8) + 0x28) = count;
  *(size_t *)(this + 0x10) = count;
  return bVar15;
}

Assistant:

bool
	setCountImpl(size_t count) {
		size_t size = count * sizeof(T);

		if (this->m_hdr &&
			this->m_hdr->getRefCount() == 1) {
			if (this->m_count == count)
				return true;

			if (this->m_hdr->m_bufferSize >= size) {
				if (count > this->m_count)
					Construct() (this->m_p + this->m_count, count - this->m_count);
				else
					Details::destruct(this->m_p + count, this->m_count - count);

				Details::setHdrCount(this->m_hdr, count);
				this->m_count = count;
				return true;
			}
		}

		if (count == 0) {
			this->release();
			return true;
		}

		if (!this->m_count) {
			bool result = reserve(count);
			if (!result)
				return false;

			Construct() (this->m_p, count);
			Details::setHdrCount(this->m_hdr, count);
			this->m_count = count;
			return true;
		}

		ASSERT(this->m_hdr);

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_EXTRA(Hdr, (bufferSize), bufferSize);
		if (!hdr)
			return false;

		Details::setHdrCount(hdr, count);

		T* p = (T*)(hdr + 1);

		if (count <= this->m_count) {
			Details::constructCopy(p, this->m_p, count);
		} else {
			Details::constructCopy(p, this->m_p, this->m_count);
			Construct() (p + this->m_count, count - this->m_count);
		}

		this->m_hdr->release();

		this->m_p = p;
		this->m_hdr = hdr.detach();
		this->m_count = count;
		return true;
	}